

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int fffvcl(fitsfile *fptr,int *nvarcols,int *colnums,int *status)

{
  int iVar1;
  int *in_RCX;
  long in_RDX;
  int *in_RSI;
  long in_RDI;
  tcolumn *colptr;
  int icol;
  int tfields;
  undefined8 local_38;
  undefined4 local_30;
  undefined4 local_4;
  
  *in_RSI = 0;
  if (*in_RCX < 1) {
    if (*(int *)(*(long *)(in_RDI + 8) + 0x58) == 2) {
      if (*(long *)(*(long *)(in_RDI + 8) + 0x3d0) != 0) {
        local_38 = *(long *)(*(long *)(in_RDI + 8) + 0x3d0);
        iVar1 = *(int *)(*(long *)(in_RDI + 8) + 0x3b0);
        for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
          if (*(int *)(local_38 + 0x50) < 0) {
            if (in_RDX != 0) {
              *(int *)(in_RDX + (long)*in_RSI * 4) = local_30 + 1;
            }
            *in_RSI = *in_RSI + 1;
          }
          local_38 = local_38 + 0xa0;
        }
      }
      local_4 = *in_RCX;
    }
    else {
      ffpmsg((char *)0x13a778);
      *in_RCX = 0xe3;
      local_4 = 0xe3;
    }
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int fffvcl(fitsfile *fptr,   /* I - FITS file pointer                       */
           int *nvarcols,    /* O - Number of variable length columns found */
           int *colnums,     /* O - 1-based variable column positions       */
           int *status)      /* IO - error status                           */
{
/*
   Internal function to identify which columns in a binary table are variable length.
   The colnums array will be filled with nvarcols elements - the 1-based numbers
   of all variable length columns in the table.  This ASSUMES calling function
   has passed in a colnums array large enough to hold these (colnums==NULL also 
   allowed).
*/
   int tfields=0,icol;
   tcolumn *colptr=0;
   
   *nvarcols = 0;
   if (*status > 0)
       return(*status);
       
   if ((fptr->Fptr)->hdutype != BINARY_TBL)
   {
      ffpmsg("Var-length column search can only be performed on Binary tables (fffvcl)");
      return(*status = NOT_BTABLE);
   }
   
   if ((fptr->Fptr)->tableptr)
   {
      colptr = (fptr->Fptr)->tableptr;
      tfields = (fptr->Fptr)->tfield;
      for (icol=0; icol<tfields; ++icol, ++colptr)
      {
         /* Condition for variable length column: negative tdatatype */
         if (colptr->tdatatype < 0)
         {
	    if (colnums) colnums[*nvarcols] = icol + 1;
	    *nvarcols += 1;            
         }
      }      
   }   
   return(*status);
}